

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O3

ArgIface * __thiscall Args::Arg::findArgument(Arg *this,String *name)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  Arg *pAVar4;
  bool bVar5;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  lVar3 = std::__cxx11::string::find((char *)name,0x13089f,0);
  if (lVar3 == 0) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
    plVar1 = local_40;
    if (local_38 == (this->m_name)._M_string_length) {
      if (local_38 == 0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp(local_40,(this->m_name)._M_dataplus._M_p,local_38);
        bVar5 = iVar2 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (plVar1 != local_30) {
      operator_delete(plVar1,local_30[0] + 1);
    }
    if (bVar5) {
      return &this->super_ArgIface;
    }
  }
  pAVar4 = (Arg *)0x0;
  lVar3 = std::__cxx11::string::find((char *)name,0x13089f,0);
  if (lVar3 != 0) {
    pAVar4 = (Arg *)0x0;
    lVar3 = std::__cxx11::string::find((char)name,0x2d);
    if (lVar3 == 0) {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
      if (local_38 == (this->m_flag)._M_string_length) {
        pAVar4 = this;
        if (local_38 != 0) {
          iVar2 = bcmp(local_40,(this->m_flag)._M_dataplus._M_p,local_38);
          pAVar4 = (Arg *)0x0;
          if (iVar2 == 0) {
            pAVar4 = this;
          }
        }
      }
      else {
        pAVar4 = (Arg *)0x0;
      }
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
    }
  }
  return &pAVar4->super_ArgIface;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name ) override
	{
		if( details::isArgument( name ) && name.substr( 2 ) == m_name )
			return this;
		else if( details::isFlag( name ) && name.substr( 1 ) == m_flag )
			return this;
		else
			return nullptr;
	}